

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O0

bool __thiscall CsvModelSerialiser::loadModel(CsvModelSerialiser *this,QByteArray *source)

{
  QFlags<QIODeviceBase::OpenModeFlag> QVar1;
  CsvModelSerialiserPrivate *this_00;
  QTextStream local_38 [8];
  QTextStream reader;
  CsvModelSerialiserPrivate *d;
  QByteArray *source_local;
  CsvModelSerialiser *this_local;
  
  this_00 = d_func(this);
  if ((this_00->super_AbstractSingleRoleSerialiserPrivate).super_AbstractStringSerialiserPrivate.
      super_AbstractModelSerialiserPrivate.m_model == (QAbstractItemModel *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    QVar1 = operator|(ReadOnly,Text);
    QTextStream::QTextStream(local_38,(QByteArray *)source,(QFlags_conflict1 *)(ulong)QVar1.i);
    this_local._7_1_ = CsvModelSerialiserPrivate::readCsv(this_00,local_38);
    QTextStream::~QTextStream(local_38);
  }
  return this_local._7_1_;
}

Assistant:

bool CsvModelSerialiser::loadModel(const QByteArray &source)
{
    Q_D(CsvModelSerialiser);

    if (!d->m_model)
        return false;
    QTextStream reader(source, QIODevice::ReadOnly | QIODevice::Text);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    reader.setCodec(textCodec());
#endif
    return d->readCsv(reader);
}